

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O2

void monster_list_collect(monster_list_t *list)

{
  undefined8 *puVar1;
  short *psVar2;
  uint uVar3;
  monster_list_entry_t *pmVar4;
  monster_race *pmVar5;
  loc grid1;
  loc grid2;
  size_t sVar6;
  player *ppVar7;
  long lVar8;
  _Bool _Var9;
  wchar_t wVar10;
  wchar_t wVar11;
  monster *mon;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  
  if (((list != (monster_list_t *)0x0) && (list->entries != (monster_list_entry_t *)0x0)) &&
     (sVar6 = list->entries_size, wVar10 = cave_monster_max(cave), wVar10 <= (wchar_t)sVar6)) {
    for (wVar10 = L'\x01'; wVar11 = cave_monster_max(cave), wVar10 < wVar11;
        wVar10 = wVar10 + L'\x01') {
      mon = cave_monster(cave,wVar10);
      _Var9 = monster_is_visible(mon);
      if ((_Var9) && (_Var9 = monster_is_camouflaged(mon), !_Var9)) {
        uVar3 = (uint)list->entries_size;
        uVar12 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar12 = 0;
        }
        lVar8 = 0;
        do {
          lVar13 = lVar8;
          if (uVar12 * 0x20 + 0x20 == lVar13 + 0x20) goto LAB_00168013;
          pmVar4 = list->entries;
          pmVar5 = *(monster_race **)((long)pmVar4->count + lVar13 + -8);
          if (pmVar5 == (monster_race *)0x0) {
            puVar1 = (undefined8 *)((long)pmVar4->dx + lVar13);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)((long)pmVar4->count + lVar13 + -8);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(monster_race **)((long)pmVar4->count + lVar13 + -8) = mon->race;
            break;
          }
          lVar8 = lVar13 + 0x20;
        } while (pmVar5 != mon->race);
        *(uint8_t *)((long)pmVar4->dy + lVar13 + 4) = mon->attr;
        grid1.x = (player->grid).x;
        grid1.y = (player->grid).y;
        grid2.x = (mon->grid).x;
        grid2.y = (mon->grid).y;
        _Var9 = projectable((chunk *)cave,grid1,grid2,L'\0');
        uVar12 = (ulong)!_Var9;
        psVar2 = (short *)((long)pmVar4->count + uVar12 * 2 + lVar13);
        *psVar2 = *psVar2 + 1;
        if (0 < mon->m_timed[0]) {
          psVar2 = (short *)((long)pmVar4->asleep + lVar13 + uVar12 * 2);
          *psVar2 = *psVar2 + 1;
        }
        ppVar7 = player;
        *(short *)((long)pmVar4->dx + lVar13 + uVar12 * 2) =
             (short)(mon->grid).x - (short)(player->grid).x;
        *(short *)((long)pmVar4->dy + lVar13 + uVar12 * 2) =
             (short)(mon->grid).y - (short)(ppVar7->grid).y;
      }
LAB_00168013:
    }
    uVar3 = (uint)list->entries_size;
    uVar14 = 0;
    uVar12 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar12 = uVar14;
    }
    for (; uVar12 * 0x20 != uVar14; uVar14 = uVar14 + 0x20) {
      pmVar4 = list->entries;
      if (*(long *)((long)pmVar4->count + (uVar14 - 8)) != 0) {
        if (*(short *)((long)pmVar4->count + uVar14) != 0) {
          list->total_entries[0] = list->total_entries[0] + 1;
        }
        if (*(short *)((long)pmVar4->count + uVar14 + 2) != 0) {
          list->total_entries[1] = list->total_entries[1] + 1;
        }
        list->total_monsters[0] = list->total_monsters[0] + *(short *)((long)pmVar4->count + uVar14)
        ;
        list->total_monsters[1] =
             list->total_monsters[1] + *(short *)((long)pmVar4->count + uVar14 + 2);
        list->distinct_entries = list->distinct_entries + 1;
      }
    }
    list->creation_turn = turn;
    list->sorted = false;
  }
  return;
}

Assistant:

void monster_list_collect(monster_list_t *list)
{
	int i;

	if (list == NULL || list->entries == NULL)
		return;

	if (!monster_list_can_update(list))
		return;

	/* Use cave_monster_max() here in case the monster list isn't compacted. */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		monster_list_entry_t *entry = NULL;
		int j, field;
		bool los = false;

		/* Only consider visible, known monsters */
		if (!monster_is_visible(mon) ||	monster_is_camouflaged(mon))
			continue;

		/* Find or add a list entry. */
		for (j = 0; j < (int)list->entries_size; j++) {
			if (list->entries[j].race == NULL) {
				/* We found an empty slot, so add this race here. */
				entry = &list->entries[j];
				memset(entry, 0, sizeof(monster_list_entry_t));
				entry->race = mon->race;
				break;
			}
			else if (list->entries[j].race == mon->race) {
				/* We found a matching race and we'll use that. */
				entry = &list->entries[j];
				break;
			}
		}

		if (entry == NULL)
			continue;

		/* Always collect the latest monster attribute so that flicker
		 * animation works. If this is 0, it needs to be replaced by 
		 * the standard glyph in the UI */
		entry->attr = mon->attr;

		/*
		 * Check for LOS
		 * Hack - we should use (mon->mflag & (MFLAG_VIEW)) here,
		 * but this does not catch monsters detected by ESP which are
		 * targetable, so we cheat and use projectable() instead
		 */
		los = projectable(cave, player->grid, mon->grid, PROJECT_NONE);
		field = (los) ? MONSTER_LIST_SECTION_LOS : MONSTER_LIST_SECTION_ESP;
		entry->count[field]++;

		if (mon->m_timed[MON_TMD_SLEEP] > 0)
			entry->asleep[field]++;

		/* Store the location offset from the player; this is only used for
		 * monster counts of 1 */
		entry->dx[field] = mon->grid.x - player->grid.x;
		entry->dy[field] = mon->grid.y - player->grid.y;
	}

	/* Collect totals for easier calculations of the list. */
	for (i = 0; i < (int)list->entries_size; i++) {
		if (list->entries[i].race == NULL)
			continue;

		if (list->entries[i].count[MONSTER_LIST_SECTION_LOS] > 0)
			list->total_entries[MONSTER_LIST_SECTION_LOS]++;

		if (list->entries[i].count[MONSTER_LIST_SECTION_ESP] > 0)
			list->total_entries[MONSTER_LIST_SECTION_ESP]++;

		list->total_monsters[MONSTER_LIST_SECTION_LOS] +=
			list->entries[i].count[MONSTER_LIST_SECTION_LOS];
		list->total_monsters[MONSTER_LIST_SECTION_ESP] +=
			list->entries[i].count[MONSTER_LIST_SECTION_ESP];
		list->distinct_entries++;
	}

	list->creation_turn = turn;
	list->sorted = false;
}